

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_bfexts_32_pcdi(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  sbyte sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) != 0) {
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar6 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar6 = pmmu_translate_addr(uVar6);
    }
    uVar1 = m68k_read_memory_16(uVar6 & m68ki_cpu.address_mask);
    uVar6 = m68ki_cpu.pc;
    m68ki_address_space = 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar8 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar8 = pmmu_translate_addr(uVar8);
    }
    uVar2 = m68k_read_memory_16(uVar8 & m68ki_cpu.address_mask);
    if ((uVar1 >> 0xb & 1) == 0) {
      uVar8 = uVar1 >> 6 & 0x1f;
    }
    else {
      uVar8 = m68ki_cpu.dar[uVar1 >> 6 & 7];
    }
    uVar9 = uVar1;
    if ((uVar1 & 0x20) != 0) {
      uVar9 = m68ki_cpu.dar[uVar1 & 7];
    }
    uVar3 = uVar8 + 7;
    if (-1 < (int)uVar8) {
      uVar3 = uVar8;
    }
    uVar7 = (int)(short)uVar2 + uVar6 + ((int)uVar3 >> 3) + -1 +
            (uint)((uVar8 & 0x80000007) < 0x80000001);
    uVar2 = uVar9 - 1 & 0x1f;
    my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
    uVar6 = uVar7;
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar6 = pmmu_translate_addr(uVar7);
    }
    uVar3 = m68k_read_memory_32(uVar6 & m68ki_cpu.address_mask);
    sVar5 = (sbyte)(uVar8 & 7);
    uVar3 = uVar3 << sVar5;
    if (0x20 < (uVar8 & 7) + uVar2 + 1) {
      uVar7 = uVar7 + 4;
      my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
      if (m68ki_cpu.pmmu_enabled != 0) {
        uVar7 = pmmu_translate_addr(uVar7);
      }
      uVar4 = m68k_read_memory_8(uVar7 & m68ki_cpu.address_mask);
      uVar3 = uVar3 | (uVar4 << sVar5) >> 8;
    }
    m68ki_cpu.n_flag = uVar3 >> 0x18;
    m68ki_cpu.not_z_flag = (int)uVar3 >> (~(byte)uVar2 & 0x1f);
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 10 & 0x1c)) = m68ki_cpu.not_z_flag;
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_bfexts_32_pcdi(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		uint width = word2;
		uint data;
		uint ea = EA_PCDI_8();


		if(BIT_B(word2))
			offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		offset %= 8;
		if(offset < 0)
		{
			offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;

		data = m68ki_read_32(ea);

		data = MASK_OUT_ABOVE_32(data<<offset);

		if((offset+width) > 32)
			data |= (m68ki_read_8(ea+4) << offset) >> 8;

		FLAG_N = NFLAG_32(data);
		data  = MAKE_INT_32(data) >> (32 - width);

		FLAG_Z = data;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		REG_D[(word2 >> 12) & 7] = data;

		return;
	}
	m68ki_exception_illegal();
}